

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

void __thiscall
gnuplotio::
deref_and_print<gnuplotio::PairOfRange<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::IteratorRange<double_const*,double>>,gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
          (gnuplotio *this,long stream,undefined8 param_3,int param_4)

{
  size_t __n;
  value_type local_18;
  
  deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
            ();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  local_18 = IteratorRange<const_double_*,_double>::deref
                       ((IteratorRange<const_double_*,_double> *)(stream + 0x20));
  FloatTextSender<double>::send((int)this,&local_18,__n,param_4);
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const PairOfRange<T, U> &arg, PrintMode) {
    deref_and_print(stream, arg.l, PrintMode());
    if(PrintMode::is_text) stream << " ";
    deref_and_print(stream, arg.r, PrintMode());
}